

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O3

int gears_engine_init(gears_engine_t *gears_engine,int width,int height)

{
  gears_t *pgVar1;
  
  if (gears_engine != (gears_engine_t *)0x0) {
    pgVar1 = (*gears_engine->engine->init)(width,height);
    gears_engine->gears = pgVar1;
    return -(uint)(pgVar1 == (gears_t *)0x0);
  }
  return -1;
}

Assistant:

int gears_engine_init(gears_engine_t *gears_engine, int width, int height)
{
  if (!gears_engine) {
    return -1;
  }

  gears_engine->gears = gears_engine->engine->init(width, height);
  if (!gears_engine->gears) {
    return -1;
  }

  return 0;
}